

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smart_ban.cpp
# Opt level: O1

void __thiscall
libtorrent::anon_unknown_13::smart_ban_plugin::on_piece_failed
          (smart_ban_plugin *this,piece_index_t p)

{
  uint uVar1;
  element_type *peVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  ulong uVar8;
  pointer pptVar9;
  peer_request r;
  vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
  downloaders;
  int local_e4;
  int local_e0;
  int local_dc;
  int local_d8;
  uint local_d4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d0;
  enable_shared_from_this<libtorrent::(anonymous_namespace)::smart_ban_plugin> local_c8;
  undefined8 *local_b8;
  undefined8 uStack_b0;
  code *local_a8;
  code *pcStack_a0;
  vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_> local_90
  ;
  smart_ban_plugin *local_78;
  enable_shared_from_this<libtorrent::(anonymous_namespace)::smart_ban_plugin> *local_70;
  pointer local_68;
  long *local_60;
  ulong local_58;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined8 local_38;
  
  if (((this->m_torrent->super_torrent_hot_members).field_0x4b & 4) == 0) {
    aux::piece_picker::get_downloaders
              (&local_90,
               (this->m_torrent->super_torrent_hot_members).m_picker._M_t.
               super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
               ._M_t.
               super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
               .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl,p);
    iVar6 = file_storage::piece_size
                      (&((this->m_torrent->super_torrent_hot_members).m_torrent_file.
                         super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->m_files,p);
    local_e0 = 0;
    local_dc = 0x4000;
    if (iVar6 < 0x4000) {
      local_dc = iVar6;
    }
    local_68 = local_90.
               super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    local_e4 = p.m_val;
    if (local_90.
        super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_90.
        super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_70 = &this->
                  super_enable_shared_from_this<libtorrent::(anonymous_namespace)::smart_ban_plugin>
      ;
      uVar8 = (ulong)(uint)p.m_val;
      pptVar9 = local_90.
                super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_78 = this;
      do {
        iVar6 = iVar6 + -0x4000;
        if (*pptVar9 != (torrent_peer *)0x0) {
          iVar7 = (*(((this->m_torrent->super_torrent_hot_members).m_ses)->super_session_logger).
                    _vptr_session_logger[4])();
          uVar1 = (this->m_torrent->m_storage).m_idx.m_val;
          ::std::enable_shared_from_this<libtorrent::(anonymous_namespace)::smart_ban_plugin>::
          shared_from_this(&local_c8);
          local_d8 = iVar6;
          local_d4 = uVar1;
          local_60 = (long *)CONCAT44(extraout_var,iVar7);
          local_58 = uVar8;
          aux::torrent_peer::address(*pptVar9);
          uVar5 = local_38;
          uVar4 = local_4c;
          uVar3 = local_50;
          peVar2 = local_c8._M_weak_this.
                   super___weak_ptr<libtorrent::(anonymous_namespace)::smart_ban_plugin,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          iVar6 = local_dc;
          local_d0 = local_c8._M_weak_this.
                     super___weak_ptr<libtorrent::(anonymous_namespace)::smart_ban_plugin,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
          local_c8._M_weak_this.
          super___weak_ptr<libtorrent::(anonymous_namespace)::smart_ban_plugin,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          local_c8._M_weak_this.
          super___weak_ptr<libtorrent::(anonymous_namespace)::smart_ban_plugin,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_b8 = (undefined8 *)0x0;
          uStack_b0 = 0;
          local_a8 = (code *)0x0;
          pcStack_a0 = (code *)0x0;
          local_b8 = (undefined8 *)operator_new(0x50);
          uVar8 = local_58;
          *local_b8 = on_read_failed_block;
          local_b8[1] = 0;
          *(int *)(local_b8 + 2) = iVar6;
          *(undefined4 *)(local_b8 + 3) = uVar3;
          *(undefined4 *)((long)local_b8 + 0x1c) = uVar4;
          *(undefined4 *)(local_b8 + 4) = local_48;
          *(undefined4 *)((long)local_b8 + 0x24) = uStack_44;
          *(undefined4 *)(local_b8 + 5) = uStack_40;
          *(undefined4 *)((long)local_b8 + 0x2c) = uStack_3c;
          local_b8[6] = uVar5;
          local_b8[7] = local_58;
          local_b8[8] = peVar2;
          local_b8[9] = local_d0;
          pcStack_a0 = ::std::
                       _Function_handler<void_(libtorrent::disk_buffer_holder,_const_libtorrent::storage_error_&),_std::_Bind<void_(libtorrent::(anonymous_namespace)::smart_ban_plugin::*(std::shared_ptr<libtorrent::(anonymous_namespace)::smart_ban_plugin>,_libtorrent::piece_block,_boost::asio::ip::address,_std::_Placeholder<1>,_int,_std::_Placeholder<2>))(libtorrent::piece_block,_boost::asio::ip::address,_libtorrent::disk_buffer_holder,_int,_const_libtorrent::storage_error_&)>_>
                       ::_M_invoke;
          local_a8 = ::std::
                     _Function_handler<void_(libtorrent::disk_buffer_holder,_const_libtorrent::storage_error_&),_std::_Bind<void_(libtorrent::(anonymous_namespace)::smart_ban_plugin::*(std::shared_ptr<libtorrent::(anonymous_namespace)::smart_ban_plugin>,_libtorrent::piece_block,_boost::asio::ip::address,_std::_Placeholder<1>,_int,_std::_Placeholder<2>))(libtorrent::piece_block,_boost::asio::ip::address,_libtorrent::disk_buffer_holder,_int,_const_libtorrent::storage_error_&)>_>
                     ::_M_manager;
          (**(code **)(*local_60 + 0x10))(local_60,local_d4,&local_e4,&local_b8,1);
          this = local_78;
          iVar6 = local_d8;
          if (local_a8 != (code *)0x0) {
            (*local_a8)(&local_b8,&local_b8,3);
          }
        }
        local_e0 = local_e0 + 0x4000;
        local_dc = 0x4000;
        if (iVar6 < 0x4000) {
          local_dc = iVar6;
        }
        pptVar9 = pptVar9 + 1;
        uVar8 = uVar8 + 0x100000000;
      } while (pptVar9 != local_68);
    }
    if (local_90.
        super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_90.
                      super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_90.
                            super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_90.
                            super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void on_piece_failed(piece_index_t const p) override
		{
			// The piece failed the hash check. Record
			// the CRC and origin peer of every block

			// if the torrent is aborted, no point in starting
			// a bunch of read operations on it
			if (m_torrent.is_aborted()) return;

			std::vector<aux::torrent_peer*> const downloaders
				= m_torrent.picker().get_downloaders(p);

			int size = m_torrent.torrent_file().piece_size(p);
			peer_request r = {p, 0, std::min(16*1024, size)};
			piece_block pb(p, 0);
			for (auto const& i : downloaders)
			{
				if (i != nullptr)
				{
					// for very sad and involved reasons, this read need to force a copy out of the cache
					// since the piece has failed, this block is very likely to be replaced with a newly
					// downloaded one very soon, and to get a block by reference would fail, since the
					// block read will have been deleted by the time it gets back to the network thread
					m_torrent.session().disk_thread().async_read(m_torrent.storage(), r
						, std::bind(&smart_ban_plugin::on_read_failed_block
						, shared_from_this(), pb, i->address(), _1, r.length, _2)
						, disk_interface::force_copy);
				}

				r.start += 16*1024;
				size -= 16*1024;
				r.length = std::min(16*1024, size);
				++pb.block_index;
			}
			TORRENT_ASSERT(size <= 0);
		}